

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall inja::Parser::add_to_template_storage(Parser *this,path *path,string *template_name)

{
  uint uVar1;
  pointer pcVar2;
  ParserConfig *pPVar3;
  undefined1 auVar4 [16];
  int iVar5;
  iterator iVar6;
  long *plVar7;
  mapped_type *tmpl;
  undefined8 *puVar8;
  _Rb_tree_header *p_Var9;
  undefined1 auVar10 [16];
  string text;
  string original_name;
  Template include_template;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined1 local_2d8 [16];
  _Rb_tree_node_base local_2c8;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
  local_290;
  path local_260;
  Template local_238;
  undefined1 auStack_150 [288];
  
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
          ::find(&this->template_storage->_M_t,template_name);
  p_Var9 = &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node != p_Var9) {
    return;
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  pcVar2 = (template_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,pcVar2,pcVar2 + template_name->_M_string_length);
  if (this->config->search_included_templates_in_files == true) {
    ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_2d8,&local_318,auto_format);
    std::filesystem::__cxx11::operator/((path *)&local_238,path,(path *)local_2d8);
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,local_238.root.super_AstNode._vptr_AstNode,
               (long)local_238.root.super_AstNode._vptr_AstNode + local_238.root.super_AstNode.pos);
    ::std::__cxx11::string::operator=((string *)template_name,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)&local_238);
    std::filesystem::__cxx11::path::~path((path *)local_2d8);
    iVar5 = ::std::__cxx11::string::compare((ulong)template_name,0,(char *)0x2);
    if (iVar5 == 0) {
      ::std::__cxx11::string::erase((ulong)template_name,0);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
            ::find(&this->template_storage->_M_t,template_name);
    p_Var9 = &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar6._M_node != p_Var9) goto LAB_0012e3ed;
    ::std::ifstream::ifstream(&local_238);
    ::std::ifstream::open((string *)&local_238,(_Ios_Openmode)template_name);
    p_Var9 = (_Rb_tree_header *)local_238.root.super_AstNode._vptr_AstNode[-3];
    uVar1 = *(uint *)((long)((long)&local_238.root.nodes.
                                    super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
                                    ._M_impl.super__Vector_impl_data + 0x10U) + (long)p_Var9);
    if ((uVar1 & 5) == 0) {
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      ::std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_338,
                 *(undefined8 *)(auStack_150 + (long)local_238.root.super_AstNode._vptr_AstNode[-3])
                 ,0xffffffff,0,0xffffffff);
      local_2f8 = &local_2e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,local_338._M_dataplus._M_p,
                 local_338._M_dataplus._M_p + local_338._M_string_length);
      local_2c8._M_right = (_Base_ptr)&local_2a0;
      local_2d8._8_8_ = 0;
      local_2d8._0_8_ = &PTR_accept_00154018;
      local_2c8._0_8_ = 0;
      local_2c8._M_parent = (_Base_ptr)0x0;
      local_2c8._M_left = (_Base_ptr)0x0;
      if (local_2f8 == &local_2e8) {
        local_2a0._8_8_ = local_2e8._8_8_;
      }
      else {
        local_2c8._M_right = (_Base_ptr)local_2f8;
      }
      local_2a0._M_allocated_capacity._1_7_ = local_2e8._M_allocated_capacity._1_7_;
      local_2a0._M_local_buf[0] = local_2e8._M_local_buf[0];
      p_Var9 = &local_290._M_impl.super__Rb_tree_header;
      local_2a8 = local_2f0;
      local_2f0 = 0;
      local_2e8._M_local_buf[0] = '\0';
      local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2f8 = &local_2e8;
      local_290._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
      local_290._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
      ::_M_emplace_unique<std::__cxx11::string&,inja::Template&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                  *)this->template_storage,template_name,(Template *)local_2d8);
      tmpl = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
             ::operator[](this->template_storage,template_name);
      ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_260,template_name,auto_format);
      parse_into_template(this,tmpl,&local_260);
      std::filesystem::__cxx11::path::~path(&local_260);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
      ::~_Rb_tree(&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_right != &local_2a0) {
        operator_delete(local_2c8._M_right,local_2a0._M_allocated_capacity + 1);
      }
      local_2d8._0_8_ = &PTR_accept_00154018;
      std::vector<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
      ::~vector((vector<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
                 *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
LAB_0012e3d6:
      ::std::ifstream::~ifstream(&local_238);
      if ((uVar1 & 5) == 0) goto LAB_0012e476;
      goto LAB_0012e3ed;
    }
    if ((this->config->include_callback).super__Function_base._M_manager != (_Manager_type)0x0)
    goto LAB_0012e3d6;
    this = (Parser *)__cxa_allocate_exception(0x60);
    ::std::operator+(&local_338,"failed accessing file at \'",template_name);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_338);
    auVar4._8_8_ = &local_2c8;
    auVar4._0_8_ = plVar7;
    auVar10._8_8_ = (long *)*plVar7;
    auVar10._0_8_ = plVar7;
    p_Var9 = (_Rb_tree_header *)(plVar7 + 2);
    if ((_Rb_tree_header *)*plVar7 == p_Var9) {
      local_2c8._0_8_ = *(undefined8 *)&p_Var9->_M_header;
      local_2c8._M_parent = (_Base_ptr)plVar7[3];
      auVar10 = auVar4;
      goto LAB_0012e4b1;
    }
  }
  else {
LAB_0012e3ed:
    pPVar3 = this->config;
    if ((pPVar3->include_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0012e476:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    if ((pPVar3->include_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(pPVar3->include_callback)._M_invoker)
                (&local_238,(_Any_data *)&pPVar3->include_callback,path,&local_318);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
      ::_M_emplace_unique<std::__cxx11::string&,inja::Template&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                  *)this->template_storage,template_name,&local_238);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
      ::~_Rb_tree(&local_238.block_storage._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.content._M_dataplus._M_p != &local_238.content.field_2) {
        operator_delete(local_238.content._M_dataplus._M_p,
                        local_238.content.field_2._M_allocated_capacity + 1);
      }
      local_238.root.super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_00154018;
      std::vector<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
      ::~vector(&local_238.root.nodes);
      goto LAB_0012e476;
    }
    auVar10 = ::std::__throw_bad_function_call();
  }
  local_2c8._0_8_ = *(undefined8 *)&p_Var9->_M_header;
LAB_0012e4b1:
  local_2d8._0_8_ = auVar10._8_8_;
  puVar8 = auVar10._0_8_;
  local_2d8._8_8_ = puVar8[1];
  *puVar8 = p_Var9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  FileError::FileError((FileError *)this,(string *)local_2d8);
  __cxa_throw(this,&FileError::typeinfo,InjaError::~InjaError);
}

Assistant:

void add_to_template_storage(const std::filesystem::path& path, std::string& template_name) {
    if (template_storage.find(template_name) != template_storage.end()) {
      return;
    }

    const std::string original_name = template_name;

    if (config.search_included_templates_in_files) {
      // Build the relative path
      template_name = (path / original_name).string();
      if (template_name.compare(0, 2, "./") == 0) {
        template_name.erase(0, 2);
      }

      if (template_storage.find(template_name) == template_storage.end()) {
        // Load file
        std::ifstream file;
        file.open(template_name);
        if (!file.fail()) {
          const std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());

          auto include_template = Template(text);
          template_storage.emplace(template_name, include_template);
          parse_into_template(template_storage[template_name], template_name);
          return;
        } else if (!config.include_callback) {
          INJA_THROW(FileError("failed accessing file at '" + template_name + "'"));
        }
      }
    }

    // Try include callback
    if (config.include_callback) {
      auto include_template = config.include_callback(path, original_name);
      template_storage.emplace(template_name, include_template);
    }
  }